

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O2

void test_shader_program_compilation
               (GLuint p_shader,vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  key_type *pkVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  uint *p_iter;
  key_type *__k;
  GLint success;
  GLchar info_log [1024];
  int local_43c;
  GLchar local_438 [1032];
  
  (*glad_glGetProgramiv)(p_shader,0x8b82,&local_43c);
  if (local_43c == 0) {
    (*glad_glGetProgramInfoLog)(p_shader,0x400,(GLsizei *)0x0,local_438);
    poVar2 = std::operator<<((ostream *)&std::cerr,"p_shader:");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," shader program compilation failed");
    std::operator<<(poVar2,"\n");
    pkVar1 = (p_shaders->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (p_shaders->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start; __k != pkVar1; __k = __k + 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"id: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"filepath: ");
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ShaderFile>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ShaderFile>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)ShaderDb::file_map,__k);
      poVar2 = std::operator<<(poVar2,(string *)pmVar3);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"type: ");
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ShaderFile>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ShaderFile>,_std::allocator<std::pair<const_unsigned_int,_ShaderFile>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)ShaderDb::file_map,__k);
      poVar2 = operator<<(poVar2,pmVar3->m_type);
      std::operator<<(poVar2,"\n");
    }
    poVar2 = std::operator<<((ostream *)&std::cout,local_438);
    std::operator<<(poVar2,"\n");
  }
  return;
}

Assistant:

void test_shader_program_compilation(
    const GLuint p_shader,
    const std::vector<GLuint> &p_shaders) noexcept
{
    static constexpr auto info_log_size = 1024;
    GLint success;
    GLchar info_log[info_log_size];
    glGetProgramiv(p_shader, GL_LINK_STATUS, &success);
    if (!success)
    {
        glGetProgramInfoLog(p_shader, info_log_size, nullptr, info_log);
        std::cerr << "p_shader:" << p_shader << " shader program compilation failed"
                  << "\n";
        for (const auto &p_iter : p_shaders)
        {
            std::cerr << "id: " << p_iter << "\n";
            std::cerr << "filepath: " << ShaderDb::file_map.at(p_iter).m_filepath << "\n";
            std::cerr << "type: " << ShaderDb::file_map.at(p_iter).m_type << "\n";
        }
        std::cout << info_log << "\n";
    }
}